

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O2

uint32_t __thiscall kaitai::kstream::read_u4le(kstream *this)

{
  uint32_t t;
  
  std::istream::read((char *)this->m_io,(long)&t);
  return t;
}

Assistant:

uint32_t kaitai::kstream::read_u4le() {
    uint32_t t;
    m_io->read(reinterpret_cast<char *>(&t), 4);
#if __BYTE_ORDER == __BIG_ENDIAN
    t = bswap_32(t);
#endif
    return t;
}